

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_diag_mask_inf_impl(ggml_context *ctx,ggml_tensor *a,int n_past,_Bool inplace)

{
  ggml_tensor *pgVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,inplace) == 0) {
    pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
  }
  else {
    pgVar1 = ggml_view_tensor(ctx,a);
  }
  if (pgVar1 != (ggml_tensor *)0x0) {
    pgVar1->op_params[0] = n_past;
    pgVar1->op = GGML_OP_DIAG_MASK_INF;
    pgVar1->src[0] = a;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-impl.h"
             ,0x70,"GGML_ASSERT(%s) failed","tensor != NULL");
}

Assistant:

static struct ggml_tensor * ggml_diag_mask_inf_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[] = { n_past };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_DIAG_MASK_INF;
    result->src[0] = a;

    return result;
}